

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::NonMaximumSuppression::MergePartialFromCodedStream
          (NonMaximumSuppression *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  double *pdVar4;
  bool bVar5;
  short extraout_AX;
  short extraout_AX_00;
  short extraout_AX_01;
  short extraout_AX_02;
  short extraout_AX_03;
  short sVar6;
  int iVar7;
  uint uVar8;
  uint extraout_EAX;
  uint32 uVar9;
  Int64Vector *this_00;
  ulong extraout_RAX;
  NonMaximumSuppression_PickTop *this_01;
  ulong extraout_RAX_00;
  StringVector *this_02;
  ulong extraout_RAX_01;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  double local_78;
  ClassLabelsUnion *local_70;
  SuppressionMethodUnion *local_68;
  ArenaStringPtr *local_60;
  ArenaStringPtr *local_58;
  ArenaStringPtr *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  
  local_38 = &this->coordinatesoutputfeaturename_;
  local_40 = &this->confidenceoutputfeaturename_;
  local_48 = &this->confidencethresholdinputfeaturename_;
  local_50 = &this->iouthresholdinputfeaturename_;
  local_58 = &this->coordinatesinputfeaturename_;
  local_60 = &this->confidenceinputfeaturename_;
  local_70 = &this->ClassLabels_;
  local_68 = &this->SuppressionMethod_;
  do {
    pbVar3 = input->buffer_;
    uVar9 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar11 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar9 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) ||
           (uVar9 = (uint)bVar2, (~(uint)*pbVar1 & uVar11) < 0x80)) goto LAB_004cf946;
        uVar11 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar12 = (ulong)uVar11 | 0x100000000;
    }
    else {
LAB_004cf946:
      uVar9 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar9);
      uVar12 = 0;
      if (uVar9 - 1 < 0x3fff) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar9 | uVar12;
    }
    uVar11 = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto switchD_004cf896_caseD_cc;
    uVar8 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar12;
    if (uVar8 < 0x6e) {
      if (uVar8 == 1) {
        if (cVar10 != '\n') goto switchD_004cf896_caseD_cc;
        if (this->_oneof_case_[0] != 1) {
          this->_oneof_case_[0] = 1;
          this_01 = (NonMaximumSuppression_PickTop *)operator_new(0x18);
          NonMaximumSuppression_PickTop::NonMaximumSuppression_PickTop(this_01);
          (this->SuppressionMethod_).picktop_ = this_01;
        }
        MergePartialFromCodedStream();
        uVar12 = extraout_RAX_00;
LAB_004cf874:
        if ((uVar12 & 1) == 0) {
LAB_004cf6da:
          iVar7 = 0;
        }
        else {
LAB_004cf93e:
          iVar7 = local_78._0_4_;
        }
      }
      else {
        if (uVar8 == 100) {
          if (cVar10 != '\"') goto switchD_004cf896_caseD_cc;
          if (this->_oneof_case_[1] != 100) {
            clear_ClassLabels(this);
            this->_oneof_case_[1] = 100;
            this_02 = (StringVector *)operator_new(0x30);
            StringVector::StringVector(this_02);
            (this->ClassLabels_).stringclasslabels_ = this_02;
          }
          MergePartialFromCodedStream();
          uVar12 = extraout_RAX_01;
          goto LAB_004cf874;
        }
        if ((uVar8 == 0x65) && (cVar10 == '*')) {
          if (this->_oneof_case_[1] != 0x65) {
            clear_ClassLabels(this);
            this->_oneof_case_[1] = 0x65;
            this_00 = (Int64Vector *)operator_new(0x28);
            Int64Vector::Int64Vector(this_00);
            (this->ClassLabels_).int64classlabels_ = this_00;
          }
          MergePartialFromCodedStream();
          uVar12 = extraout_RAX;
          goto LAB_004cf874;
        }
switchD_004cf896_caseD_cc:
        iVar7 = 7;
        if ((uVar11 & 7) != 4 && uVar11 != 0) {
          bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar11);
          if (!bVar5) goto LAB_004cf993;
          goto LAB_004cf6da;
        }
      }
    }
    else {
      if (uVar8 != 0x6e) {
        if (uVar8 == 0x6f) {
          if (cVar10 != 'y') goto switchD_004cf896_caseD_cc;
          pdVar4 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
            bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                              (input,(uint64 *)&local_78);
            if (!bVar5) goto LAB_004cf993;
          }
          else {
            local_78 = *pdVar4;
            input->buffer_ = (uint8 *)(pdVar4 + 1);
          }
          this->confidencethreshold_ = local_78;
        }
        else {
          switch(uVar8) {
          case 200:
            MergePartialFromCodedStream();
            sVar6 = extraout_AX;
            break;
          case 0xc9:
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_03;
            break;
          case 0xca:
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_02;
            break;
          case 0xcb:
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_01;
            break;
          default:
            goto switchD_004cf896_caseD_cc;
          case 0xd2:
            MergePartialFromCodedStream();
            sVar6 = extraout_AX_00;
            break;
          case 0xd3:
            MergePartialFromCodedStream();
            if ((short)extraout_EAX == 1) goto LAB_004cf6da;
            if ((extraout_EAX & 0xffff) == 0) goto switchD_004cf896_caseD_cc;
            goto LAB_004cf93e;
          }
          if (sVar6 == 0) goto switchD_004cf896_caseD_cc;
          if (sVar6 != 1) goto LAB_004cf93e;
        }
        goto LAB_004cf6da;
      }
      if (cVar10 != 'q') goto switchD_004cf896_caseD_cc;
      pdVar4 = (double *)input->buffer_;
      if (7 < *(int *)&input->buffer_end_ - (int)pdVar4) {
        local_78 = *pdVar4;
        input->buffer_ = (uint8 *)(pdVar4 + 1);
LAB_004cf817:
        this->iouthreshold_ = local_78;
        goto LAB_004cf6da;
      }
      bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                        (input,(uint64 *)&local_78);
      if (bVar5) goto LAB_004cf817;
LAB_004cf993:
      iVar7 = 6;
    }
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool NonMaximumSuppression::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NonMaximumSuppression)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.NonMaximumSuppression.PickTop pickTop = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_picktop()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double iouThreshold = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(881u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &iouthreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double confidenceThreshold = 111;
      case 111: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(889u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &confidencethreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string confidenceInputFeatureName = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_confidenceinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->confidenceinputfeaturename().data(), this->confidenceinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.confidenceInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string coordinatesInputFeatureName = 201;
      case 201: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1610u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_coordinatesinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->coordinatesinputfeaturename().data(), this->coordinatesinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.coordinatesInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string iouThresholdInputFeatureName = 202;
      case 202: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1618u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_iouthresholdinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->iouthresholdinputfeaturename().data(), this->iouthresholdinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.iouThresholdInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string confidenceThresholdInputFeatureName = 203;
      case 203: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1626u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_confidencethresholdinputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->confidencethresholdinputfeaturename().data(), this->confidencethresholdinputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.confidenceThresholdInputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string confidenceOutputFeatureName = 210;
      case 210: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1682u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_confidenceoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->confidenceoutputfeaturename().data(), this->confidenceoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.confidenceOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string coordinatesOutputFeatureName = 211;
      case 211: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1690u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_coordinatesoutputfeaturename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->coordinatesoutputfeaturename().data(), this->coordinatesoutputfeaturename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.NonMaximumSuppression.coordinatesOutputFeatureName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NonMaximumSuppression)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NonMaximumSuppression)
  return false;
#undef DO_
}